

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O2

wchar_t * LocalWideStringBuider(char *cbuffer,wchar_t *buffer,size_t buffer_capacity)

{
  char cVar1;
  wchar_t *pwVar2;
  
  if (buffer != (wchar_t *)0x0 && buffer_capacity != 0) {
    memset(buffer,0,buffer_capacity * 4);
    if (cbuffer != (char *)0x0) {
      pwVar2 = buffer;
      while (pwVar2 < buffer + buffer_capacity) {
        cVar1 = *cbuffer;
        cbuffer = cbuffer + 1;
        *pwVar2 = (int)cVar1;
        pwVar2 = pwVar2 + 1;
        if (cVar1 == '\0') {
          return buffer;
        }
      }
      memset(buffer,0,buffer_capacity * 4);
    }
  }
  return (wchar_t *)0x0;
}

Assistant:

static wchar_t* LocalWideStringBuider(
  const char* cbuffer,
  wchar_t* buffer,
  size_t buffer_capacity
  )
{
  if (buffer_capacity > 0 && nullptr != buffer)
  {
    memset(buffer, 0, buffer_capacity*sizeof(buffer[0]));
    if (nullptr != cbuffer)
    {
      wchar_t* dest = buffer;
      wchar_t* dest_end = dest + buffer_capacity;
      while (dest < dest_end)
      {
        if (0 == (*dest++ = (wchar_t)(*cbuffer++)))
          return buffer;
      }
      memset(buffer, 0, buffer_capacity*sizeof(buffer[0]));
    }
  }
  return nullptr;
}